

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
Dice::getLastResolvedHand
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,Dice *this)

{
  mapped_type mVar1;
  initializer_list<std::pair<const_int,_int>_> __l;
  size_type sVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  key_type local_ac [16];
  allocator<std::pair<const_int,_int>_> local_6a;
  less<int> local_69;
  pair<const_int,_int> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Dice *local_18;
  Dice *this_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *tempVal;
  
  local_19 = 0;
  local_48 = 4;
  uStack_40 = 5;
  local_58 = 2;
  uStack_50 = 3;
  local_68.first = 0;
  local_68.second = 0;
  uStack_60 = 1;
  local_30 = &local_68;
  local_28 = 6;
  local_18 = this;
  this_local = (Dice *)__return_storage_ptr__;
  std::allocator<std::pair<const_int,_int>_>::allocator(&local_6a);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (__return_storage_ptr__,__l,&local_69,&local_6a);
  std::allocator<std::pair<const_int,_int>_>::~allocator(&local_6a);
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[0xb] = 0;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 0xb));
  mVar1 = *pmVar4;
  local_ac[10] = 0;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac + 10);
  *pmVar4 = mVar1;
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[9] = 1;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 9));
  mVar1 = *pmVar4;
  local_ac[8] = 1;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac + 8);
  *pmVar4 = mVar1;
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[7] = 2;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 7));
  mVar1 = *pmVar4;
  local_ac[6] = 2;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac + 6);
  *pmVar4 = mVar1;
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[5] = 3;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 5));
  mVar1 = *pmVar4;
  local_ac[4] = 3;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac + 4);
  *pmVar4 = mVar1;
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[3] = 4;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 3));
  mVar1 = *pmVar4;
  local_ac[2] = 4;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac + 2);
  *pmVar4 = mVar1;
  sVar2 = std::
          vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
          ::size(&this->historyOfResolvedRolls);
  pvVar3 = std::
           vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ::operator[](&this->historyOfResolvedRolls,sVar2 - 1);
  local_ac[1] = 5;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pvVar3,(key_type *)(local_ac + 1));
  mVar1 = *pmVar4;
  local_ac[0] = 5;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,local_ac);
  *pmVar4 = mVar1;
  return __return_storage_ptr__;
}

Assistant:

map<int,int> Dice::getLastResolvedHand() {
    // 0= "Energy", 1="Attack", 2="Destruction", 3="Heal", 4="Celebrity", 5="Ouch"
    map<int,int> tempVal = {{0, 0}, {1, 0}, {2, 0}, {3, 0} , {4, 0} , {5, 0}};

    tempVal[0] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Energy];
    tempVal[1] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Attack];
    tempVal[2] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Destruction];
    tempVal[3] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Heal];
    tempVal[4] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Celebrity];
    tempVal[5] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Ouch];

    return tempVal;
}